

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_regexp_Symbol_split(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSShape *sh;
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  JSValueUnion JVar5;
  ulong uVar6;
  JSValueUnion JVar7;
  uint uVar8;
  uint uVar9;
  JSRefCountHeader *p_4;
  ulong uVar10;
  long idx;
  ulong uVar11;
  int64_t iVar12;
  ulong idx_00;
  JSValueUnion JVar13;
  JSValue JVar14;
  JSValue JVar15;
  JSValue JVar16;
  JSValue r;
  JSValue this_obj;
  JSValue v;
  JSValue JVar17;
  JSValue val;
  JSRefCountHeader *p_1;
  JSRefCountHeader *p_2;
  uint32_t lim;
  int64_t e;
  int64_t numberOfCaptures;
  JSValueUnion local_f8;
  int64_t local_e0;
  uint local_d4;
  JSValueUnion local_c0;
  ulong local_b8;
  JSValueUnion local_a8;
  ulong local_a0;
  JSValueUnion local_90;
  uint local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  long local_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  if ((int)this_val.tag != -1) {
    JVar13.float64 = 0.0;
    JS_ThrowTypeError(ctx,"not an object");
    iVar12 = 6;
    goto LAB_00140920;
  }
  JVar14 = JS_ToStringInternal(ctx,*argv,0);
  JVar13 = JVar14.u;
  if ((uint)JVar14.tag == 6) {
    this_obj = (JSValue)(ZEXT816(6) << 0x40);
    local_b8 = 0;
    r = (JSValue)(ZEXT816(3) << 0x40);
    JVar15 = (JSValue)(ZEXT816(3) << 0x40);
    v = (JSValue)(ZEXT816(3) << 0x40);
    JVar16 = (JSValue)(ZEXT816(3) << 0x40);
    local_90 = JVar13;
  }
  else {
    local_90 = (JSValueUnion)(ctx->regexp_ctor).u.ptr;
    JVar15 = JS_SpeciesConstructor(ctx,this_val,ctx->regexp_ctor);
    if ((int)JVar15.tag == 6) {
      JVar16 = (JSValue)(ZEXT816(3) << 0x40);
      this_obj = (JSValue)(ZEXT816(6) << 0x40);
      local_b8 = 0;
      r = (JSValue)(ZEXT816(3) << 0x40);
      v = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      JVar16 = JS_GetPropertyInternal(ctx,this_val,0x6d,this_val,0);
      JVar16 = JS_ToStringFree(ctx,JVar16);
      JVar5 = JVar16.u;
      local_90.float64 = JVar5.float64 >> 0x20;
      if ((int)JVar16.tag == 6) {
LAB_001401f2:
        local_b8 = 0;
        this_obj = (JSValue)(ZEXT816(6) << 0x40);
        r = (JSValue)(ZEXT816(3) << 0x40);
        v = (JSValue)(ZEXT816(3) << 0x40);
      }
      else {
        uVar2 = string_indexof_char((JSString *)JVar5.ptr,0x75,0);
        iVar3 = string_indexof_char((JSString *)JVar5.ptr,0x79,0);
        if (iVar3 < 0) {
          JVar16 = JS_ConcatString3(ctx,"",JVar16,"y");
          local_90.float64 = JVar16.u.float64 >> 0x20;
          if ((int)JVar16.tag == 6) goto LAB_001401f2;
        }
        local_58 = this_val.u;
        local_50 = this_val.tag;
        _local_48 = JVar16;
        r = JS_CallConstructorInternal(ctx,JVar15,JVar15,2,(JSValue *)&local_58,2);
        if ((int)r.tag == 6) {
          this_obj = (JSValue)(ZEXT816(6) << 0x40);
          local_b8 = 0;
LAB_00140336:
          v = (JSValue)(ZEXT816(3) << 0x40);
        }
        else {
          sh = ctx->array_shape;
          (sh->header).ref_count = (sh->header).ref_count + 1;
          this_obj = JS_NewObjectFromShape(ctx,sh,2);
          JVar5 = this_obj.u;
          if ((uint)this_obj.tag == 6) {
LAB_0014036c:
            local_e0 = 3;
            JVar7.float64 = 0.0;
LAB_001407c6:
            v.tag = local_e0;
            v.u.float64 = local_f8.float64;
            if ((0xfffffff4 < (uint)this_obj.tag) &&
               (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, iVar3 < 2)) {
              __JS_FreeValueRT(ctx->rt,this_obj);
            }
            this_obj = (JSValue)(ZEXT816(6) << 0x40);
            local_b8 = 0;
          }
          else {
            local_b8 = (ulong)JVar5.ptr >> 0x20;
            iVar12 = argv[1].tag;
            uVar4 = (uint)iVar12;
            uVar8 = 0xffffffff;
            if (uVar4 != 3) {
              JVar7 = (JSValueUnion)argv[1].u.ptr;
              if (0xfffffff4 < uVar4) {
                *(int *)JVar7.ptr = *JVar7.ptr + 1;
              }
              JVar17.tag = iVar12;
              JVar17.u.ptr = JVar7.ptr;
              iVar3 = JS_ToInt32Free(ctx,(int32_t *)&local_84,JVar17);
              if (iVar3 < 0) goto LAB_0014036c;
              uVar8 = local_84;
              if (local_84 == 0) goto LAB_00140336;
            }
            uVar9 = (uint)*(ulong *)((long)JVar13.ptr + 4);
            uVar4 = uVar9 & 0x7fffffff;
            if ((*(ulong *)((long)JVar13.ptr + 4) & 0x7fffffff) != 0) {
              uVar10 = (ulong)(uVar9 & 0x7fffffff);
              local_70 = (ulong)uVar8;
              local_68 = 2 - local_70;
              v = (JSValue)(ZEXT816(3) << 0x40);
              local_d4 = 0;
              local_a0 = 0;
              uVar11 = 0;
              local_80 = uVar10;
              do {
                local_f8 = v.u;
                val.tag = 0;
                val.u.ptr = (void *)(uVar11 & 0xffffffff);
                iVar3 = JS_SetPropertyInternal(ctx,r,0x55,val,0x4000);
                if (iVar3 < 0) goto LAB_001407c1;
                if ((0xfffffff4 < (uint)v.tag) &&
                   (iVar3 = *local_f8.ptr, *(int *)local_f8.ptr = iVar3 + -1, iVar3 < 2)) {
                  __JS_FreeValueRT(ctx->rt,v);
                }
                v = JS_RegExpExec(ctx,r,JVar14);
                if ((int)v.tag == 2) {
LAB_00140550:
                  uVar6 = string_advance_index
                                    ((JSString *)JVar13.ptr,uVar11 & 0xffffffff,~uVar2 >> 0x1f);
                  uVar11 = local_a0;
                }
                else {
                  if ((int)v.tag == 6) goto LAB_001407c1;
                  JVar17 = JS_GetPropertyInternal(ctx,r,0x55,r,0);
                  iVar3 = JS_ToLengthFree(ctx,(int64_t *)&local_78,JVar17);
                  if (iVar3 != 0) goto LAB_001407c1;
                  uVar6 = local_78;
                  if ((long)uVar10 <= (long)local_78) {
                    uVar6 = uVar10;
                  }
                  local_78 = uVar6;
                  if (uVar6 == local_d4) goto LAB_00140550;
                  JVar17 = js_sub_string(ctx,(JSString *)JVar13.ptr,local_d4,(int)uVar11);
                  if ((int)JVar17.tag == 6) goto LAB_001407c1;
                  iVar3 = JS_DefinePropertyValueInt64(ctx,this_obj,local_a0,JVar17,0x4007);
                  if (iVar3 < 0) goto LAB_001407c1;
                  idx_00 = local_a0 + 1;
                  if (idx_00 == local_70) goto LAB_00140812;
                  iVar3 = js_get_length64(ctx,&local_60,v);
                  lVar1 = local_60;
                  if (iVar3 != 0) goto LAB_001407c1;
                  local_d4 = (uint)uVar6;
                  uVar10 = local_80;
                  uVar11 = idx_00;
                  if (1 < local_60) {
                    uVar11 = local_a0 + local_60;
                    idx = 1;
                    do {
                      JVar17 = JS_GetPropertyInt64(ctx,v,idx);
                      JVar17 = JS_ToStringFree(ctx,JVar17);
                      if ((int)JVar17.tag == 6) goto LAB_001407c1;
                      iVar3 = JS_DefinePropertyValueInt64(ctx,this_obj,idx_00,JVar17,0x4007);
                      if (iVar3 < 0) goto LAB_001407c1;
                      if (local_68 + idx_00 == 1) goto LAB_00140812;
                      idx = idx + 1;
                      idx_00 = idx_00 + 1;
                      uVar10 = local_80;
                    } while (lVar1 != idx);
                  }
                }
                local_a0 = uVar11;
                uVar11 = uVar6;
              } while ((uint)uVar6 < uVar4);
LAB_0014077e:
              local_e0 = v.tag;
              local_f8 = v.u;
              if (uVar4 <= local_d4) {
                local_d4 = uVar4;
              }
              JVar17 = js_sub_string(ctx,(JSString *)JVar13.ptr,local_d4,uVar4);
              if ((int)JVar17.tag == 6) {
LAB_001407c1:
                local_e0 = v.tag;
                local_f8 = v.u;
                JVar7 = local_f8;
              }
              else {
                iVar3 = JS_DefinePropertyValueInt64(ctx,this_obj,local_a0,JVar17,0x4007);
                JVar7 = local_f8;
                if (-1 < iVar3) goto LAB_0014080d;
              }
              goto LAB_001407c6;
            }
            v = JS_RegExpExec(ctx,r,JVar14);
            local_e0 = v.tag;
            JVar7 = v.u;
            if ((int)v.tag == 2) {
              local_a0 = 0;
              local_d4 = 0;
              goto LAB_0014077e;
            }
            local_f8 = JVar7;
            if ((int)v.tag == 6) goto LAB_001407c6;
          }
LAB_0014080d:
          local_e0 = v.tag;
          v.tag = local_e0;
          v.u.float64 = JVar7.float64;
        }
      }
    }
  }
LAB_00140812:
  iVar12 = this_obj.tag;
  local_c0 = r.u;
  local_a8 = JVar16.u;
  if ((0xfffffff4 < (uint)JVar14.tag) &&
     (iVar3 = *JVar13.ptr, *(int *)JVar13.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar14);
  }
  if ((0xfffffff4 < (uint)JVar15.tag) &&
     (iVar3 = *JVar15.u.ptr, *(int *)JVar15.u.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar15);
  }
  if ((0xfffffff4 < (uint)r.tag) &&
     (iVar3 = *local_c0.ptr, *(int *)local_c0.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,r);
  }
  if (0xfffffff4 < (uint)JVar16.tag) {
    JVar14.u.ptr = (void *)((ulong)local_a8.ptr & 0xffffffff | (long)local_90.ptr << 0x20);
    iVar3 = *JVar14.u.ptr;
    *(int *)JVar14.u.ptr = iVar3 + -1;
    if (iVar3 < 2) {
      JVar14.tag = JVar16.tag;
      __JS_FreeValueRT(ctx->rt,JVar14);
    }
  }
  if ((0xfffffff4 < (uint)v.tag) && (iVar3 = *v.u.ptr, *(int *)v.u.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,v);
  }
  JVar13.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | local_b8 << 0x20);
LAB_00140920:
  JVar15.tag = iVar12;
  JVar15.u.ptr = JVar13.ptr;
  return JVar15;
}

Assistant:

static JSValue js_regexp_Symbol_split(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    // [Symbol.split](str, limit)
    JSValueConst rx = this_val;
    JSValueConst args[2];
    JSValue str, ctor, splitter, A, flags, z, sub;
    JSString *strp;
    uint32_t lim, size, p, q;
    int unicodeMatching;
    int64_t lengthA, e, numberOfCaptures, i;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    ctor = JS_UNDEFINED;
    splitter = JS_UNDEFINED;
    A = JS_UNDEFINED;
    flags = JS_UNDEFINED;
    z = JS_UNDEFINED;
    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        goto exception;
    ctor = JS_SpeciesConstructor(ctx, rx, ctx->regexp_ctor);
    if (JS_IsException(ctor))
        goto exception;
    flags = JS_ToStringFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_flags));
    if (JS_IsException(flags))
        goto exception;
    strp = JS_VALUE_GET_STRING(flags);
    unicodeMatching = string_indexof_char(strp, 'u', 0) >= 0;
    if (string_indexof_char(strp, 'y', 0) < 0) {
        flags = JS_ConcatString3(ctx, "", flags, "y");
        if (JS_IsException(flags))
            goto exception;
    }
    args[0] = rx;
    args[1] = flags;
    splitter = JS_CallConstructor(ctx, ctor, 2, args);
    if (JS_IsException(splitter))
        goto exception;
    A = JS_NewArray(ctx);
    if (JS_IsException(A))
        goto exception;
    lengthA = 0;
    if (JS_IsUndefined(argv[1])) {
        lim = 0xffffffff;
    } else {
        if (JS_ToUint32(ctx, &lim, argv[1]) < 0)
            goto exception;
        if (lim == 0)
            goto done;
    }
    strp = JS_VALUE_GET_STRING(str);
    p = q = 0;
    size = strp->len;
    if (size == 0) {
        z = JS_RegExpExec(ctx, splitter, str);
        if (JS_IsException(z))
            goto exception;
        if (JS_IsNull(z))
            goto add_tail;
        goto done;
    }
    while (q < size) {
        if (JS_SetProperty(ctx, splitter, JS_ATOM_lastIndex, JS_NewInt32(ctx, q)) < 0)
            goto exception;
        JS_FreeValue(ctx, z);    
        z = JS_RegExpExec(ctx, splitter, str);
        if (JS_IsException(z))
            goto exception;
        if (JS_IsNull(z)) {
            q = string_advance_index(strp, q, unicodeMatching);
        } else {
            if (JS_ToLengthFree(ctx, &e, JS_GetProperty(ctx, splitter, JS_ATOM_lastIndex)))
                goto exception;
            if (e > size)
                e = size;
            if (e == p) {
                q = string_advance_index(strp, q, unicodeMatching);
            } else {
                sub = js_sub_string(ctx, strp, p, q);
                if (JS_IsException(sub))
                    goto exception;
                if (JS_DefinePropertyValueInt64(ctx, A, lengthA++, sub,
                                                JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                    goto exception;
                if (lengthA == lim)
                    goto done;
                p = e;
                if (js_get_length64(ctx, &numberOfCaptures, z))
                    goto exception;
                for(i = 1; i < numberOfCaptures; i++) {
                    sub = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, z, i));
                    if (JS_IsException(sub))
                        goto exception;
                    if (JS_DefinePropertyValueInt64(ctx, A, lengthA++, sub, JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                        goto exception;
                    if (lengthA == lim)
                        goto done;
                }
                q = p;
            }
        }
    }
add_tail:
    if (p > size)
        p = size;
    sub = js_sub_string(ctx, strp, p, size);
    if (JS_IsException(sub))
        goto exception;
    if (JS_DefinePropertyValueInt64(ctx, A, lengthA++, sub, JS_PROP_C_W_E | JS_PROP_THROW) < 0)
        goto exception;
    goto done;
exception:
    JS_FreeValue(ctx, A);
    A = JS_EXCEPTION;
done:
    JS_FreeValue(ctx, str);
    JS_FreeValue(ctx, ctor);
    JS_FreeValue(ctx, splitter);
    JS_FreeValue(ctx, flags);
    JS_FreeValue(ctx, z);    
    return A;
}